

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O3

void __thiscall
amrex::MLABecLaplacian::normalize(MLABecLaplacian *this,int amrlev,int mglev,MultiFab *mf)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  Real dhz;
  Real dhy;
  Real dhx;
  MFIter mfi;
  long local_2b8;
  Box local_1ec;
  Array4<const_double> local_1d0;
  Array4<const_double> local_190;
  Array4<const_double> local_150;
  Array4<double> local_110;
  Array4<const_double> local_d0;
  MFIter local_90;
  
  lVar19 = (long)mglev;
  lVar6 = *(long *)&(this->m_a_coeffs).
                    super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                    super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>;
  lVar7 = *(long *)&(this->m_b_coeffs).
                    super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    .
                    super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[amrlev].
                    super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                    .
                    super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
  ;
  lVar13 = *(long *)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                     super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[amrlev].
                     super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                     super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
  lVar17 = lVar19 * 200;
  dVar1 = *(double *)(lVar13 + 0x38 + lVar17);
  dVar2 = *(double *)(lVar13 + 0x40 + lVar17);
  dVar3 = *(double *)(lVar13 + 0x48 + lVar17);
  dVar4 = this->m_a_scalar;
  dVar5 = this->m_b_scalar;
  uVar12 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])();
  MFIter::MFIter(&local_90,(FabArrayBase *)mf,true);
  if (local_90.currentIndex < local_90.endIndex) {
    lVar13 = lVar19 * 0x480;
    do {
      MFIter::tilebox(&local_1ec,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_110,&mf->super_FabArray<amrex::FArrayBox>,&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_d0,(FabArray<amrex::FArrayBox> *)(lVar19 * 0x180 + lVar6),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_150,(FabArray<amrex::FArrayBox> *)(lVar7 + lVar13),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_190,(FabArray<amrex::FArrayBox> *)(lVar7 + lVar13 + 0x180),&local_90);
      FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&local_1d0,(FabArray<amrex::FArrayBox> *)(lVar7 + 0x300 + lVar13),&local_90);
      if (0 < (int)uVar12) {
        lVar17 = (long)local_1ec.smallend.vect[0] * 8;
        local_2b8 = 0;
        uVar15 = 0;
        do {
          iVar18 = local_1ec.smallend.vect[2];
          if (local_1ec.smallend.vect[2] <= local_1ec.bigend.vect[2]) {
            do {
              if (local_1ec.smallend.vect[1] <= local_1ec.bigend.vect[1]) {
                lVar10 = local_190.nstride * local_2b8 +
                         (iVar18 - local_190.begin.z) * local_190.kstride * 8 +
                         (long)local_190.begin.x * -8 + lVar17;
                lVar20 = (long)local_1ec.smallend.vect[1];
                do {
                  iVar8 = (int)lVar20;
                  if (local_1ec.smallend.vect[0] <= local_1ec.bigend.vect[0]) {
                    lVar9 = (lVar20 - local_150.begin.y) * local_150.jstride * 8 +
                            local_150.nstride * local_2b8 +
                            (iVar18 - local_150.begin.z) * local_150.kstride * 8 +
                            (long)local_150.begin.x * -8 + lVar17;
                    lVar16 = (lVar20 - local_1d0.begin.y) * local_1d0.jstride * 8;
                    lVar11 = (lVar20 - local_110.begin.y) * local_110.jstride * 8 +
                             local_110.nstride * local_2b8 +
                             (iVar18 - local_110.begin.z) * local_110.kstride * 8 +
                             (long)local_110.begin.x * -8 + lVar17;
                    lVar14 = 0;
                    do {
                      *(double *)((long)local_110.p + lVar14 * 8 + lVar11) =
                           *(double *)((long)local_110.p + lVar14 * 8 + lVar11) /
                           ((*(double *)
                              ((long)local_1d0.p +
                              lVar14 * 8 +
                              lVar16 + local_1d0.kstride * 8 * (long)(iVar18 - local_1d0.begin.z) +
                                       local_1d0.nstride * local_2b8 + (long)local_1d0.begin.x * -8
                                       + lVar17) +
                            *(double *)
                             ((long)local_1d0.p +
                             lVar14 * 8 +
                             lVar16 + (long)((iVar18 + 1) - local_1d0.begin.z) *
                                      local_1d0.kstride * 8 + local_1d0.nstride * local_2b8 +
                                      (long)local_1d0.begin.x * -8 + lVar17)) *
                            dVar5 * dVar3 * dVar3 +
                           (*(double *)
                             ((long)local_190.p +
                             lVar14 * 8 +
                             (lVar20 - local_190.begin.y) * local_190.jstride * 8 + lVar10) +
                           *(double *)
                            ((long)local_190.p +
                            lVar14 * 8 +
                            (long)((iVar8 + 1) - local_190.begin.y) * local_190.jstride * 8 + lVar10
                            )) * dVar2 * dVar5 * dVar2 +
                           *(double *)
                            ((long)local_d0.p +
                            lVar14 * 8 +
                            (lVar20 - local_d0.begin.y) * local_d0.jstride * 8 +
                            (iVar18 - local_d0.begin.z) * local_d0.kstride * 8 +
                            (long)local_d0.begin.x * -8 + lVar17) * dVar4 +
                           (*(double *)((long)local_150.p + lVar14 * 8 + lVar9) +
                           *(double *)((long)local_150.p + lVar14 * 8 + lVar9 + 8)) *
                           dVar1 * dVar5 * dVar1);
                      lVar14 = lVar14 + 1;
                    } while ((local_1ec.bigend.vect[0] - local_1ec.smallend.vect[0]) + 1 !=
                             (int)lVar14);
                  }
                  lVar20 = lVar20 + 1;
                } while (iVar8 + 1 != local_1ec.bigend.vect[1] + 1);
              }
              iVar18 = iVar18 + 1;
            } while (iVar18 != local_1ec.bigend.vect[2] + 1);
          }
          uVar15 = uVar15 + 1;
          local_2b8 = local_2b8 + 8;
        } while (uVar15 != uVar12);
      }
      MFIter::operator++(&local_90);
    } while (local_90.currentIndex < local_90.endIndex);
  }
  MFIter::~MFIter(&local_90);
  return;
}

Assistant:

void
MLABecLaplacian::normalize (int amrlev, int mglev, MultiFab& mf) const
{
    BL_PROFILE("MLABecLaplacian::normalize()");

    const MultiFab& acoef = m_a_coeffs[amrlev][mglev];
    AMREX_D_TERM(const MultiFab& bxcoef = m_b_coeffs[amrlev][mglev][0];,
                 const MultiFab& bycoef = m_b_coeffs[amrlev][mglev][1];,
                 const MultiFab& bzcoef = m_b_coeffs[amrlev][mglev][2];);

    const auto dxinv = m_geom[amrlev][mglev].InvCellSizeArray();

    const Real ascalar = m_a_scalar;
    const Real bscalar = m_b_scalar;

    const int ncomp = getNComp();

#ifdef AMREX_USE_GPU
    if (Gpu::inLaunchRegion() && mf.isFusingCandidate()) {
        const auto& ma = mf.arrays();
        const auto& ama = acoef.const_arrays();
        AMREX_D_TERM(const auto& bxma = bxcoef.const_arrays();,
                     const auto& byma = bycoef.const_arrays();,
                     const auto& bzma = bzcoef.const_arrays(););
        ParallelFor(mf, IntVect(0), ncomp,
        [=] AMREX_GPU_DEVICE (int box_no, int i, int j, int k, int n) noexcept
        {
            mlabeclap_normalize(i,j,k,n, ma[box_no], ama[box_no],
                                AMREX_D_DECL(bxma[box_no],byma[box_no],bzma[box_no]),
                                dxinv, ascalar, bscalar);
        });
        Gpu::streamSynchronize();
    } else
#endif
    {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(mf, TilingIfNotGPU()); mfi.isValid(); ++mfi)
        {
            const Box& bx = mfi.tilebox();
            const auto& fab = mf.array(mfi);
            const auto& afab = acoef.array(mfi);
            AMREX_D_TERM(const auto& bxfab = bxcoef.array(mfi);,
                         const auto& byfab = bycoef.array(mfi);,
                         const auto& bzfab = bzcoef.array(mfi););

            AMREX_HOST_DEVICE_PARALLEL_FOR_4D(bx, ncomp, i, j, k, n,
            {
                mlabeclap_normalize(i,j,k,n, fab, afab, AMREX_D_DECL(bxfab,byfab,bzfab),
                                    dxinv, ascalar, bscalar);
            });
        }
    }
}